

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O1

MOJOSHADER_astDataType *
build_function_datatype
          (Context_conflict *ctx,MOJOSHADER_astDataType *rettype,int paramcount,
          MOJOSHADER_astDataType **params,int intrinsic)

{
  int iVar1;
  void *pvVar2;
  MOJOSHADER_astDataType *pMVar3;
  void *ptr;
  MOJOSHADER_astDataType *local_40;
  MOJOSHADER_astDataType *local_38;
  
  if (paramcount < 1) {
    pMVar3 = (MOJOSHADER_astDataType *)0x0;
  }
  else {
    local_38 = rettype;
    local_40 = (MOJOSHADER_astDataType *)
               (*ctx->malloc)((int)((ulong)(uint)paramcount << 3),ctx->malloc_data);
    if (local_40 == (MOJOSHADER_astDataType *)0x0) goto LAB_0013fe57;
    iVar1 = buffer_append(ctx->garbage,&local_40,8);
    pMVar3 = local_40;
    if (iVar1 == 0) {
      pvVar2 = ctx->malloc_data;
      goto LAB_0013fe7b;
    }
    memcpy(local_40,params,(ulong)(uint)paramcount << 3);
    rettype = local_38;
  }
  local_40 = (MOJOSHADER_astDataType *)(*ctx->malloc)(0x20,ctx->malloc_data);
  if (local_40 != (MOJOSHADER_astDataType *)0x0) {
    iVar1 = buffer_append(ctx->garbage,&local_40,8);
    if (iVar1 != 0) {
      local_40->type = MOJOSHADER_AST_DATATYPE_FUNCTION;
      (local_40->array).base = rettype;
      (local_40->user).name = (char *)pMVar3;
      (local_40->function).num_params = paramcount;
      (local_40->function).intrinsic = intrinsic;
      return local_40;
    }
    pvVar2 = ctx->malloc_data;
LAB_0013fe7b:
    (*ctx->free)(local_40,pvVar2);
    return (MOJOSHADER_astDataType *)0x0;
  }
LAB_0013fe57:
  ctx->isfail = 1;
  ctx->out_of_memory = 1;
  return (MOJOSHADER_astDataType *)0x0;
}

Assistant:

static const MOJOSHADER_astDataType *build_function_datatype(Context *ctx,
                                        const MOJOSHADER_astDataType *rettype,
                                        const int paramcount,
                                        const MOJOSHADER_astDataType **params,
                                        const int intrinsic)
{
    const MOJOSHADER_astDataType **dtparams = NULL;
    void *ptr;

    if (paramcount > 0)
    {
        // !!! FIXME: this is hacky.
        ptr = Malloc(ctx, sizeof (*params) * paramcount);
        if (ptr == NULL)
            return NULL;
        if (!buffer_append(ctx->garbage, &ptr, sizeof (ptr)))
        {
            Free(ctx, ptr);
            return NULL;
        } // if
        dtparams = (const MOJOSHADER_astDataType **) ptr;
        memcpy(dtparams, params, sizeof (*params) * paramcount);
    }

    ptr = Malloc(ctx, sizeof (MOJOSHADER_astDataType));
    if (ptr == NULL)
        return NULL;
    if (!buffer_append(ctx->garbage, &ptr, sizeof (ptr)))
    {
        Free(ctx, ptr);
        return NULL;
    } // if

    MOJOSHADER_astDataType *dt = (MOJOSHADER_astDataType *) ptr;
    dt->type = MOJOSHADER_AST_DATATYPE_FUNCTION;
    dt->function.retval = rettype;
    dt->function.params = dtparams;
    dt->function.num_params = paramcount;
    dt->function.intrinsic = intrinsic;
    return dt;
}